

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_device_fp_flags_t capabilities)

{
  uint in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  allocator local_16;
  undefined1 local_15;
  uint local_14;
  string *psStack_10;
  ze_device_fp_flags_t capabilities_local;
  string *capabilities_str;
  
  this = (string *)CONCAT44(in_register_0000003c,capabilities);
  local_15 = 0;
  local_14 = in_ESI;
  psStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this,"",&local_16);
  std::allocator<char>::~allocator((allocator<char> *)&local_16);
  if (local_14 == 0) {
    std::__cxx11::string::append((char *)this);
  }
  else {
    if ((local_14 & 1) != 0) {
      std::__cxx11::string::append((char *)this);
    }
    if ((local_14 & 2) != 0) {
      std::__cxx11::string::append((char *)this);
    }
    if ((local_14 & 4) != 0) {
      std::__cxx11::string::append((char *)this);
    }
    if ((local_14 & 8) != 0) {
      std::__cxx11::string::append((char *)this);
    }
    if ((local_14 & 0x10) != 0) {
      std::__cxx11::string::append((char *)this);
    }
    if ((local_14 & 0x20) != 0) {
      std::__cxx11::string::append((char *)this);
    }
    if ((local_14 & 0x40) != 0) {
      std::__cxx11::string::append((char *)this);
    }
    if ((local_14 & 0x80) != 0) {
      std::__cxx11::string::append((char *)this);
    }
  }
  return this;
}

Assistant:

std::string to_string(const ze_device_fp_flags_t capabilities) {
  std::string capabilities_str = "";
  if (capabilities == 0) {
    capabilities_str.append("|NONE|");
    return capabilities_str;
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_DENORM) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_DENORM|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_INF_NAN) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_INF_NAN|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_ROUND_TO_NEAREST) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_ROUND_TO_NEAREST|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_ROUND_TO_ZERO) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_ROUND_TO_ZERO|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_ROUND_TO_INF) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_ROUND_TO_INF|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_FMA) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_FMA|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_ROUNDED_DIVIDE_SQRT) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_ROUNDED_DIVIDE_SQRT|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_SOFT_FLOAT) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_SOFT_FLOAT|");
  }
  return capabilities_str;
}